

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbscreen.cpp
# Opt level: O0

QFbWindow * __thiscall QFbScreen::windowForId(QFbScreen *this,WId wid)

{
  QList<QFbWindow_*> *this_00;
  qsizetype qVar1;
  const_reference ppQVar2;
  long lVar3;
  long in_RSI;
  long in_RDI;
  int i;
  qsizetype in_stack_ffffffffffffffc8;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    this_00 = (QList<QFbWindow_*> *)(long)local_1c;
    qVar1 = QList<QFbWindow_*>::size((QList<QFbWindow_*> *)(in_RDI + 0x20));
    if (qVar1 <= (long)this_00) {
      return (QFbWindow *)0x0;
    }
    ppQVar2 = QList<QFbWindow_*>::operator[](this_00,in_stack_ffffffffffffffc8);
    lVar3 = (**(code **)(*(long *)*ppQVar2 + 0x68))();
    if (lVar3 == in_RSI) break;
    local_1c = local_1c + 1;
  }
  ppQVar2 = QList<QFbWindow_*>::operator[](this_00,in_stack_ffffffffffffffc8);
  return *ppQVar2;
}

Assistant:

QFbWindow *QFbScreen::windowForId(WId wid) const
{
    for (int i = 0; i < mWindowStack.size(); ++i) {
        if (mWindowStack[i]->winId() == wid)
            return mWindowStack[i];
    }
    return nullptr;
}